

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::Frame::value(Frame *this,int frameNo)

{
  undefined4 in_ESI;
  long in_RDI;
  float fVar1;
  Frame *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  fVar1 = (float)((ulong)(in_RDI + 0x10) >> 0x20);
  progress(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  fVar1 = Value<float,_void>::at
                    ((Value<float,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),fVar1);
  return fVar1;
}

Assistant:

T     value(int frameNo) const { return value_.at(progress(frameNo)); }